

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChatBox.h
# Opt level: O2

void __thiscall gui::ChatBox::~ChatBox(ChatBox *this)

{
  (this->super_Widget).super_Drawable._vptr_Drawable = (_func_int **)&PTR__ChatBox_0026ef20;
  std::_Function_base::~_Function_base(&(this->hideCallback_).super__Function_base);
  std::
  vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
  ::~vector(&this->visibleLines_);
  std::deque<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>::~deque(&this->lines_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->style_).super___shared_ptr<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
  ::~_Rb_tree(&(this->onClick).callbacks_._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>_>_>_>
  ::~_Rb_tree(&(this->onMouseRelease).callbacks_._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>_>_>_>
  ::~_Rb_tree(&(this->onMousePress).callbacks_._M_t);
  Widget::~Widget(&this->super_Widget);
  return;
}

Assistant:

virtual ~ChatBox() = default;